

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image-util.cc
# Opt level: O2

bool tinyusdz::srgb_f32_to_linear_f32
               (vector<float,_std::allocator<float>_> *in_img,size_t width,size_t height,
               size_t channels,size_t channel_stride,vector<float,_std::allocator<float>_> *out_img,
               float scale_factor,float bias,float alpha_scale_factor,float alpha_bias,string *err)

{
  pointer pfVar1;
  ostream *poVar2;
  long lVar3;
  pointer pcVar4;
  size_t sVar5;
  size_t sVar6;
  char *pcVar7;
  size_t sVar8;
  long lVar9;
  bool bVar10;
  float fVar11;
  size_t dest_size;
  ostringstream ss_e;
  allocator local_279;
  size_t local_278;
  undefined4 local_26c;
  float local_268;
  float local_264;
  float local_260;
  float local_25c;
  size_t local_258;
  size_t local_250;
  string local_248;
  size_t local_228;
  size_t local_220;
  long local_218;
  long local_210;
  size_t local_208;
  string local_200;
  undefined1 local_1e0 [56];
  ostringstream local_1a8 [376];
  
  local_268 = scale_factor;
  local_264 = bias;
  local_260 = alpha_scale_factor;
  local_25c = alpha_bias;
  local_1e0._0_8_ = channel_stride;
  local_1e0._8_8_ = channels;
  if (width == 0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar2 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"srgb_f32_to_linear_f32");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x1da);
    ::std::operator<<(poVar2," ");
    pcVar7 = "width is zero.";
  }
  else if (height == 0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar2 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"srgb_f32_to_linear_f32");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x1de);
    ::std::operator<<(poVar2," ");
    pcVar7 = "height is zero.";
  }
  else if (channels == 0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar2 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"srgb_f32_to_linear_f32");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x1e2);
    ::std::operator<<(poVar2," ");
    pcVar7 = "channels is zero.";
  }
  else {
    if (out_img != (vector<float,_std::allocator<float>_> *)0x0) {
      sVar8 = channels;
      if ((channel_stride == 0) || (sVar8 = channel_stride, channels <= channel_stride)) {
        local_248._M_dataplus._M_p = (pointer)(height * width * sVar8);
        lVar3 = (long)(in_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(in_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                      super__Vector_impl_data._M_start;
        pcVar4 = (pointer)(lVar3 >> 2);
        bVar10 = (long)local_248._M_dataplus._M_p - (long)pcVar4 == 0;
        local_26c = (undefined4)
                    CONCAT71((int7)(lVar3 >> 10),local_248._M_dataplus._M_p < pcVar4 || bVar10);
        if (local_248._M_dataplus._M_p < pcVar4 || bVar10) {
          local_278 = width;
          ::std::vector<float,_std::allocator<float>_>::resize
                    (out_img,(size_type)local_248._M_dataplus._M_p);
          local_248.field_2._M_allocated_capacity = sVar8 * local_278;
          local_248._M_string_length = local_248.field_2._M_allocated_capacity * 4;
          local_210 = sVar8 * 4;
          lVar3 = 0;
          local_258 = channels;
          local_248.field_2._8_8_ = height;
          for (local_228 = 0; local_228 != local_248.field_2._8_8_; local_228 = local_228 + 1) {
            local_250 = channels;
            local_220 = channels;
            local_218 = lVar3;
            for (local_208 = 0; sVar6 = local_258, lVar9 = lVar3, local_208 != local_278;
                local_208 = local_208 + 1) {
              while (bVar10 = sVar6 != 0, sVar6 = sVar6 - 1, bVar10) {
                fVar11 = SrgbTransform::srgbToLinear
                                   (*(float *)((long)(in_img->
                                                  super__Vector_base<float,_std::allocator<float>_>)
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar9)
                                    * local_268 + local_264);
                *(float *)((long)(out_img->super__Vector_base<float,_std::allocator<float>_>).
                                 _M_impl.super__Vector_impl_data._M_start + lVar9) = fVar11;
                lVar9 = lVar9 + 4;
              }
              pfVar1 = (in_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              sVar6 = local_250;
              for (sVar5 = local_258; sVar5 < sVar8; sVar5 = sVar5 + 1) {
                (out_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_start[sVar6] = pfVar1[sVar6] * local_260 + local_25c;
                sVar6 = sVar6 + 1;
              }
              lVar3 = lVar3 + local_210;
              local_250 = local_250 + sVar8;
            }
            lVar3 = local_218 + local_248._M_string_length;
            channels = local_220 + local_248.field_2._M_allocated_capacity;
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_1a8);
          poVar2 = ::std::operator<<((ostream *)local_1a8,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"srgb_f32_to_linear_f32");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,499);
          ::std::operator<<(poVar2," ");
          ::std::__cxx11::string::string
                    ((string *)(local_1e0 + 0x18),
                     "Insufficient input buffer size. must be the same or larger than {} but has {}"
                     ,&local_279);
          local_1e0._16_8_ =
               (long)(in_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(in_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 2;
          fmt::format<unsigned_long,unsigned_long>
                    (&local_200,(fmt *)(local_1e0 + 0x18),&local_248,
                     (unsigned_long *)(local_1e0 + 0x10),(unsigned_long *)channel_stride);
          poVar2 = ::std::operator<<((ostream *)local_1a8,(string *)&local_200);
          ::std::operator<<(poVar2,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::append((string *)err);
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
        }
        return (bool)(char)local_26c;
      }
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      poVar2 = ::std::operator<<((ostream *)local_1a8,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"srgb_f32_to_linear_f32");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x1ed);
      ::std::operator<<(poVar2," ");
      ::std::__cxx11::string::string
                ((string *)(local_1e0 + 0x18),"channel_stride {} is smaller than input channels {}",
                 (allocator *)&local_248);
      fmt::format<unsigned_long,unsigned_long>
                (&local_200,(fmt *)(local_1e0 + 0x18),(string *)local_1e0,
                 (unsigned_long *)(local_1e0 + 8),(unsigned_long *)channel_stride);
      poVar2 = ::std::operator<<((ostream *)local_1a8,(string *)&local_200);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      goto LAB_00349b58;
    }
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar2 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"srgb_f32_to_linear_f32");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x1e6);
    ::std::operator<<(poVar2," ");
    pcVar7 = "`out_img` is nullptr.";
  }
  poVar2 = ::std::operator<<((ostream *)local_1a8,pcVar7);
  ::std::operator<<(poVar2,"\n");
LAB_00349b58:
  if (err != (string *)0x0) {
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::append((string *)err);
    ::std::__cxx11::string::_M_dispose();
  }
  ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return false;
}

Assistant:

bool srgb_f32_to_linear_f32(const std::vector<float> &in_img, size_t width,
                         size_t height,
                         size_t channels, size_t channel_stride,
                         std::vector<float> *out_img, const float scale_factor, const float bias, const float alpha_scale_factor, const float alpha_bias, std::string *err) {

  if (width == 0) {
    PUSH_ERROR_AND_RETURN("width is zero.");
  }

  if (height == 0) {
    PUSH_ERROR_AND_RETURN("height is zero.");
  }

  if (channels == 0) {
    PUSH_ERROR_AND_RETURN("channels is zero.");
  }

  if (out_img == nullptr) {
    PUSH_ERROR_AND_RETURN("`out_img` is nullptr.");
  }

  if (channel_stride == 0) {
    channel_stride = channels;
  } else {
    if (channel_stride < channels) {
      PUSH_ERROR_AND_RETURN(fmt::format("channel_stride {} is smaller than input channels {}", channel_stride, channels));
    }
  }

  size_t dest_size = size_t(width) * size_t(height) * channel_stride;
  if (dest_size > in_img.size()) {
    PUSH_ERROR_AND_RETURN(fmt::format("Insufficient input buffer size. must be the same or larger than {} but has {}", dest_size, in_img.size()));
  }

  out_img->resize(dest_size);

  // assume input is in [0.0, 1.0]
  for (size_t y = 0; y < height; y++) {
    for (size_t x = 0; x < width; x++) {
      for (size_t c = 0; c < channels; c++) {
        size_t idx = channel_stride * width * y + channel_stride * x + c;
        float f = in_img[idx] * scale_factor + bias;
        (*out_img)[idx] = SrgbTransform::srgbToLinear(f);
      }

      // remainder(usually alpha channel)
      // Apply linear conversion.
      for (size_t c = channels; c < channel_stride; c++) {
        size_t idx = channel_stride * width * y + channel_stride * x + c;
        float f = in_img[idx] * alpha_scale_factor + alpha_bias;
        (*out_img)[idx] = f;
      }
    }
  }

  return true;
}